

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

char othercase(int ch)

{
  ushort uVar1;
  ushort **ppuVar2;
  
  ppuVar2 = __ctype_b_loc();
  uVar1 = (*ppuVar2)[ch];
  if ((uVar1 >> 10 & 1) != 0) {
    if ((uVar1 >> 8 & 1) == 0) {
      if ((uVar1 >> 9 & 1) != 0) {
        ch = toupper(ch);
      }
    }
    else {
      ch = tolower(ch);
    }
    return (char)ch;
  }
  __assert_fail("isalpha(ch)",
                "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                ,0x3c6,"char othercase()");
}

Assistant:

static char			/* if no counterpart, return ch */
othercase(ch)
int ch;
{
	assert(isalpha(ch));
	if (isupper(ch))
		return((char)tolower(ch));
	else if (islower(ch))
		return((char)toupper(ch));
	else			/* peculiar, but could happen */
		return((char)ch);
}